

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetProgram(GLContextState *this,GLProgramObj *GLProgram)

{
  bool bVar1;
  GLenum err;
  GLuint GLProgHandle;
  string msg;
  uint local_40;
  GLuint local_3c;
  string local_38;
  
  local_3c = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>>
                    (&this->m_GLProgId,GLProgram,&local_3c);
  if (bVar1) {
    (*__glewUseProgram)(local_3c);
    local_40 = glGetError();
    if (local_40 != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95,(char (*) [25])"Failed to set GL program",(char (*) [17])"\nGL Error Code: ",
                 &local_40);
      FormatString<char[6]>(&local_38,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void GLContextState::SetProgram(const GLProgramObj& GLProgram)
{
    GLuint GLProgHandle = 0;
    if (UpdateBoundObject(m_GLProgId, GLProgram, GLProgHandle))
    {
        glUseProgram(GLProgHandle);
        DEV_CHECK_GL_ERROR("Failed to set GL program");
    }
}